

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

void gl3cts::TextureSwizzle::calculate_expected_value
               (size_t source_format_idx,size_t output_format_idx,size_t index_of_swizzled_channel,
               GLint source_size,GLint output_size,void *out_expected_data_low,
               void *out_expected_data_top,size_t *out_expected_data_size)

{
  double dVar1;
  void *__src;
  size_t __n;
  _out_ch_desc *p_Var2;
  TestError *this;
  uint uVar3;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double ch_rgba [4];
  double local_58 [5];
  ulong uVar4;
  
  p_Var2 = get_descriptor_for_channel
                     ((_texture_format *)(&texture_formats + source_format_idx * 0x1e),
                      index_of_swizzled_channel);
  uVar3 = *(int *)(&DAT_021da0cc + output_format_idx * 0x78) - 0x1400;
  uVar4 = (ulong)uVar3;
  if ((uVar3 < 0xc) && ((0x87fU >> (uVar3 & 0x1f) & 1) != 0)) {
    __src = p_Var2->m_expected_data;
    __n = *(size_t *)(&DAT_01a3fa20 + uVar4 * 8);
    if (__src != (void *)0x0) {
      memcpy(out_expected_data_top,__src,__n);
      memcpy(out_expected_data_low,__src,__n);
      *out_expected_data_size = __n;
      return;
    }
    dVar1 = *(double *)(&DAT_01a3fae0 + uVar4 * 8);
    dVar15 = *(double *)(&DAT_01a3fa80 + uVar4 * 8);
    iVar6 = source_size + *(int *)(&DAT_01a3fb40 + uVar4 * 4);
    iVar5 = output_size + *(int *)(&DAT_01a3fb40 + uVar4 * 4);
    calculate_values_from_source(source_format_idx,local_58);
    auVar13._8_4_ = iVar6 >> 0x1f;
    auVar13._0_8_ = (long)iVar6;
    auVar13._12_4_ = 0x45300000;
    dVar10 = exp2((auVar13._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0));
    fVar7 = (float)(dVar10 + -1.0);
    auVar14._8_4_ = iVar5 >> 0x1f;
    auVar14._0_8_ = (long)iVar5;
    auVar14._12_4_ = 0x45300000;
    dVar11 = exp2((auVar14._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0));
    dVar10 = local_58[index_of_swizzled_channel];
    fVar8 = floorf((float)dVar10 * fVar7 + -1.0);
    fVar9 = ceilf((float)dVar10 * fVar7 + 1.0);
    fVar8 = floorf((fVar8 / fVar7) * (float)(dVar11 + -1.0));
    fVar7 = ceilf((fVar9 / fVar7) * (float)(dVar11 + -1.0));
    if (*(int *)(&DAT_021da0cc + output_format_idx * 0x78) - 0x1400U < 6) {
      dVar12 = (double)fVar8;
      dVar11 = (double)fVar7;
      dVar10 = dVar15;
      if (dVar12 <= dVar15) {
        dVar10 = dVar12;
      }
      if (dVar11 <= dVar15) {
        dVar15 = dVar11;
      }
      (*(code *)(&DAT_01a3f684 +
                *(int *)(&DAT_01a3f684 +
                        (ulong)(*(int *)(&DAT_021da0cc + output_format_idx * 0x78) - 0x1400U) * 4)))
                (-(ulong)(dVar11 < dVar1) & (ulong)dVar1 | ~-(ulong)(dVar11 < dVar1) & (ulong)dVar15
                 ,-(ulong)(dVar12 < dVar1) & (ulong)dVar1 |
                  ~-(ulong)(dVar12 < dVar1) & (ulong)dVar10);
      return;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x705);
  }
  else {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x6be);
  }
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void calculate_expected_value(size_t source_format_idx, size_t output_format_idx, size_t index_of_swizzled_channel,
							  glw::GLint source_size, glw::GLint output_size, void* out_expected_data_low,
							  void* out_expected_data_top, size_t& out_expected_data_size)
{
	const _texture_format& output_format = texture_formats[output_format_idx];
	const _texture_format& source_format = texture_formats[source_format_idx];
	const _out_ch_desc&	desc			 = get_descriptor_for_channel(source_format, index_of_swizzled_channel);
	const glw::GLvoid*	 expected_data = desc.m_expected_data;
	bool				   is_signed	 = false;
	double				   range_low	 = 0.0f;
	double				   range_top	 = 0.0f;
	size_t				   texel_size	= 0;

	/* Select range, texel size and is_signed */
	switch (output_format.m_type)
	{
	case GL_BYTE:
		is_signed = true;

		range_low = -127.0;
		range_top = 127.0;

		texel_size = 1;

		break;

	case GL_UNSIGNED_BYTE:
		range_low = 0.0;
		range_top = 255.0;

		texel_size = 1;

		break;

	case GL_SHORT:
		is_signed = true;

		range_low = -32767.0;
		range_top = 32767.0;

		texel_size = 2;

		break;

	case GL_UNSIGNED_SHORT:
		range_low = 0.0;
		range_top = 65535.0;

		texel_size = 2;

		break;

	case GL_HALF_FLOAT:
		texel_size = 2;

		/* Halfs are not calculated, range will not be used */

		break;

	case GL_INT:
		is_signed = true;

		range_low = -2147483647.0;
		range_top = 2147483647.0;

		texel_size = 4;

		break;

	case GL_UNSIGNED_INT:
		range_low = 0.0;
		range_top = 4294967295.0;

		texel_size = 4;

		break;

	case GL_FLOAT:
		texel_size = 4;

		/* Float are not calculated, range will not be used */

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Signed formats use one bit less */
	if (true == is_signed)
	{
		source_size -= 1;
		output_size -= 1;
	}

	/* If expected data is hardcoded just copy data to low and top */
	if (DE_NULL != expected_data)
	{
		memcpy(out_expected_data_top, expected_data, texel_size);
		memcpy(out_expected_data_low, expected_data, texel_size);
		out_expected_data_size = texel_size;
	}
	else
	{
		/* Get source values */
		double ch_rgba[4];
		calculate_values_from_source(source_format_idx, ch_rgba);

		/* Calculate expected value */
		const float max_internal  = float(calculate_max_for_size(source_size));
		const float max_output	= float(calculate_max_for_size(output_size));
		const float temp_internal = float(ch_rgba[index_of_swizzled_channel]) * max_internal;
		const float stor_internal_low =
			deFloatFloor(temp_internal - 1.0f); /* Offset by 1 to avoid rounding done by FPU */
		const float stor_internal_top =
			deFloatCeil(temp_internal + 1.0f); /* Offset by 1 to avoid rounding done by FPU */
		const float read_internal_low = stor_internal_low / max_internal;
		const float read_internal_top = stor_internal_top / max_internal;
		const float temp_output_low   = read_internal_low * max_output;
		const float temp_output_top   = read_internal_top * max_output;
		double		stor_output_low   = floor(temp_output_low);
		double		stor_output_top   = ceil(temp_output_top);

		/* Clamp to limits of output format */
		stor_output_low = de::clamp(stor_output_low, range_low, range_top);
		stor_output_top = de::clamp(stor_output_top, range_low, range_top);

		/* Store resuts */
		switch (output_format.m_type)
		{
		case GL_BYTE:
			convert<glw::GLbyte>(out_expected_data_low, stor_output_low);
			convert<glw::GLbyte>(out_expected_data_top, stor_output_top);
			break;
		case GL_UNSIGNED_BYTE:
			convert<glw::GLubyte>(out_expected_data_low, stor_output_low);
			convert<glw::GLubyte>(out_expected_data_top, stor_output_top);
			break;
		case GL_SHORT:
			convert<glw::GLshort>(out_expected_data_low, stor_output_low);
			convert<glw::GLshort>(out_expected_data_top, stor_output_top);
			break;
		case GL_UNSIGNED_SHORT:
			convert<glw::GLushort>(out_expected_data_low, stor_output_low);
			convert<glw::GLushort>(out_expected_data_top, stor_output_top);
			break;
		case GL_INT:
			convert<glw::GLint>(out_expected_data_low, stor_output_low);
			convert<glw::GLint>(out_expected_data_top, stor_output_top);
			break;
		case GL_UNSIGNED_INT:
			convert<glw::GLuint>(out_expected_data_low, stor_output_low);
			convert<glw::GLuint>(out_expected_data_top, stor_output_top);
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
		out_expected_data_size = texel_size;
	}
}